

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O3

void __thiscall
highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>
          (HighwayHashCatT<1U> *this,unsigned_long *hash)

{
  uint64_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  HHStateT<1U> *pHVar9;
  HHStatePortable *pHVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  ulong __n;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Lanes packet_lanes;
  HHStateT<1U> state_copy;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  uint64_t local_100;
  uint64_t uStack_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  HHStatePortable local_d8;
  
  pHVar9 = &this->state_;
  pHVar10 = &local_d8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pHVar10->v0[0] = pHVar9->v0[0];
    pHVar9 = (HHStateT<1U> *)(pHVar9->v0 + 1);
    pHVar10 = (HHStatePortable *)(pHVar10->v0 + 1);
  }
  uVar7 = this->buffer_usage_;
  if (uVar7 != 0) {
    lVar8 = uVar7 * 0x100000001;
    auVar16._8_4_ = (int)lVar8;
    auVar16._0_8_ = lVar8;
    auVar16._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar6 = 0;
    do {
      uVar1 = local_d8.v0[lVar6 + 1];
      local_d8.v0[lVar6] = local_d8.v0[lVar6] + lVar8;
      local_d8.v0[lVar6 + 1] = uVar1 + auVar16._8_8_;
      lVar6 = lVar6 + 2;
    } while (lVar6 != 4);
    uVar11 = (uint)uVar7;
    lVar8 = 8;
    auVar17._4_12_ = SUB1612((undefined1  [16])0x0,4);
    auVar17._0_4_ = 0x20 - uVar11;
    do {
      lVar6 = lVar8 * 4;
      uVar2 = *(uint *)((long)local_d8.v0 + lVar6);
      uVar3 = *(uint *)((long)local_d8.v0 + lVar6 + 4);
      uVar4 = *(uint *)((long)local_d8.v0 + lVar6 + 8);
      uVar5 = *(uint *)((long)local_d8.v0 + lVar6 + 0xc);
      lVar15 = auVar17._0_8_;
      lVar6 = lVar8 * 4;
      *(uint *)((long)local_d8.v0 + lVar6) = uVar2 >> lVar15 | uVar2 << uVar11;
      *(uint *)((long)local_d8.v0 + lVar6 + 4) = uVar3 >> lVar15 | uVar3;
      *(uint *)((long)local_d8.v0 + lVar6 + 8) = uVar4 >> lVar15 | uVar4;
      *(uint *)((long)local_d8.v0 + lVar6 + 0xc) = uVar5 >> lVar15 | uVar5;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x10);
    uVar13 = (ulong)(uVar11 & 3);
    local_120._0_12_ = ZEXT812(0);
    local_120._12_4_ = 0;
    __n = uVar7 & 0xfffffffffffffffc;
    local_110 = local_120;
    if (__n != 0) {
      memcpy(local_120,this,__n);
    }
    pcVar14 = this->buffer_ + __n;
    if ((uVar7 & 0x10) == 0) {
      if (uVar13 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)CONCAT12(pcVar14[uVar13 - 1],CONCAT11(pcVar14[(uVar11 & 3) >> 1],*pcVar14));
      }
      local_110._0_8_ = uVar7;
    }
    else {
      local_110._12_4_ = *(undefined4 *)(pcVar14 + (uVar13 - 4));
    }
    local_f0 = local_110._0_8_;
    local_e8 = local_110._8_8_;
    local_100 = local_120._0_8_;
    uStack_f8 = local_120._8_8_;
    Portable::HHStatePortable::Update(&local_d8,(Lanes *)&local_100);
  }
  iVar12 = 4;
  do {
    local_100 = local_d8.v0[2] << 0x20 | local_d8.v0[2] >> 0x20;
    uStack_f8 = local_d8.v0[3] << 0x20 | local_d8.v0[3] >> 0x20;
    local_f0 = local_d8.v0[0] << 0x20 | local_d8.v0[0] >> 0x20;
    local_e8 = local_d8.v0[1] << 0x20 | local_d8.v0[1] >> 0x20;
    Portable::HHStatePortable::Update(&local_d8,(Lanes *)&local_100);
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  *hash = local_d8.v1[0] + local_d8.v0[0] + local_d8.mul0[0] + local_d8.mul1[0];
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }